

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

iterator __thiscall Json::Value::begin(Value *this)

{
  ValueType VVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Value *in_RSI;
  iterator iVar3;
  iterator local_20 [2];
  Value *this_local;
  
  this_local = this;
  VVar1 = type(in_RSI);
  if ((VVar1 == arrayValue || VVar1 == objectValue) && ((in_RSI->value_).int_ != 0)) {
    local_20[0] = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::begin((in_RSI->value_).map_);
    ValueIterator::ValueIterator((ValueIterator *)this,local_20);
    uVar2 = extraout_RDX;
  }
  else {
    ValueIterator::ValueIterator((ValueIterator *)this);
    uVar2 = extraout_RDX_00;
  }
  iVar3.super_ValueIteratorBase._8_8_ = uVar2;
  iVar3.super_ValueIteratorBase.current_._M_node = (_Base_ptr)this;
  return (iterator)iVar3.super_ValueIteratorBase;
}

Assistant:

Value::iterator Value::begin() {
  switch (type()) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return iterator(value_.map_->begin());
    break;
  default:
    break;
  }
  return iterator();
}